

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

char * m_tmpnam(void)

{
  char *__src;
  char *tmp_path;
  char cwd [4097];
  char *local_1010;
  char local_1008 [4104];
  
  m_tmpnam::name[0] = '\0';
  local_1010 = getenv("TMPDIR");
  if (local_1010 == (char *)0x0) {
    local_1010 = getenv("TMP");
  }
  if (local_1010 == (char *)0x0) {
    local_1010 = getenv("TEMP");
  }
  if (local_1010 == (char *)0x0) {
    local_1010 = getenv("TEMPDIR");
  }
  if (local_1010 == (char *)0x0) {
    local_1010 = "";
  }
  strcpy(m_tmpnam::name,local_1010);
  getcwd(local_1008,0x1000);
  chdir(local_1010);
  __src = tmpnam((char *)0x0);
  strcat(m_tmpnam::name,__src);
  chdir(local_1008);
  return m_tmpnam::name;
}

Assistant:

char* m_tmpnam()
{
    static char name[PATH_MAX * 2 + 1];
#if !defined(__APPLE__)
    char cwd[PATH_MAX + 1];
#endif
    name[0] = 0;
#ifdef _WIN32
    GetTempPath(PATH_MAX, name);
    GetCurrentDirectory(PATH_MAX, cwd);
    SetCurrentDirectory(name);
    strcat(name, tmpnam(NULL));
    SetCurrentDirectory(cwd);
#elif defined(__APPLE__)
    strcpy(name, tmpnam(NULL));
#else
    char* tmp_path = NULL;
    tmp_path = getenv("TMPDIR");
    if (!tmp_path)
        tmp_path = getenv("TMP");
    if (!tmp_path)
        tmp_path = getenv("TEMP");
    if (!tmp_path)
        tmp_path = getenv("TEMPDIR");
    if (!tmp_path)
        tmp_path = "";

    strcpy(name, tmp_path);
    getcwd(cwd, PATH_MAX);
    chdir(tmp_path);
    strcat(name, tmpnam(NULL));
    chdir(cwd);
#endif
    return name;
}